

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_layer.c
# Opt level: O2

void avg_pooling_layer_forward(layer_t *l)

{
  data_val_t *pdVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  
  iVar13 = *(int *)&l[1].in.m;
  uVar15 = iVar13 * iVar13;
  uVar4 = *(int *)&l[1].in.grad * *(int *)((long)&l[1].in.grad + 4);
  uVar6 = 0;
  uVar14 = 0;
  if (0 < (int)uVar4) {
    uVar14 = (ulong)uVar4;
  }
  uVar3 = (ulong)*(uint *)&l[1].func;
  if ((int)*(uint *)&l[1].func < 1) {
    uVar3 = uVar6;
  }
  while (iVar13 = (int)uVar6, iVar13 < l->n->batch) {
    im2col(&(l->in).val,(l->in).size * iVar13,*(int *)&l[1].func,*(int *)&l[1].in.val,
           *(int *)((long)&l[1].func + 4),*(int *)&l[1].in.m,*(int *)((long)&l[1].in.m + 4),
           *(int *)&l[1].in.v,&(l->extra).val,0);
    iVar2 = 0;
    lVar5 = 0;
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      lVar8 = lVar5;
      for (uVar9 = 0; uVar10 = uVar14, lVar11 = lVar8, iVar7 = iVar2, uVar9 != uVar15;
          uVar9 = uVar9 + 1) {
        while (uVar10 != 0) {
          pdVar1 = (l->out).val;
          iVar12 = (l->out).size * iVar13 + iVar7;
          pdVar1[iVar12] = *(float *)((long)(l->extra).val + lVar11) + pdVar1[iVar12];
          uVar10 = uVar10 - 1;
          lVar11 = lVar11 + 4;
          iVar7 = iVar7 + 1;
        }
        lVar8 = lVar8 + (long)(int)uVar4 * 4;
      }
      for (iVar7 = 0; (int)uVar14 != iVar7; iVar7 = iVar7 + 1) {
        pdVar1 = (l->out).val;
        iVar12 = (l->out).size * iVar13 + iVar2 + iVar7;
        pdVar1[iVar12] = pdVar1[iVar12] / (float)(int)uVar15;
      }
      lVar5 = lVar5 + (long)(int)uVar15 * (long)(int)uVar4 * 4;
      iVar2 = iVar2 + uVar4;
    }
    uVar6 = (ulong)(iVar13 + 1);
  }
  return;
}

Assistant:

static void avg_pooling_layer_forward(layer_t *l)
{
	int i = 0, j = 0, k = 0, b = 0;
	pooling_layer_t *pooling = (pooling_layer_t *)l;

	int channels = pooling->ic;
	int pool_size = pooling->k * pooling->k;
	int out_size = pooling->oh * pooling->ow;

	for (b = 0; b < l->n->batch; ++b)
	{
		im2col(&l->in.val, b * l->in.size, pooling->ic, pooling->ih, pooling->iw, pooling->k, pooling->s, pooling->p, &l->extra.val, 0);

		for (k = 0; k < channels; ++k)
		{
			int offset = k * out_size;
			int pool_offset = pool_size * offset;

			for (i = 0; i < pool_size; ++i)
			{
				int index = pool_offset + i * out_size;
				for (j = 0; j < out_size; ++j)
				{
					l->out.val[b * l->out.size + offset + j] += l->extra.val[index + j];
				}
			}

			for (j = 0; j < out_size; ++j)
			{
				l->out.val[b * l->out.size + offset + j] /= pool_size;
			}
		}
	}
}